

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void __thiscall DACSThinker::Serialize(DACSThinker *this,FSerializer *arc)

{
  ScriptMap *this_00;
  DLevelScript *pDVar1;
  bool bVar2;
  hash_t hVar3;
  uint uVar4;
  DLevelScript **ppDVar5;
  Node *pNVar6;
  SavingRunningscript *def;
  uint uVar7;
  ulong uVar8;
  DObject *v;
  DLevelScript *local_40;
  DLevelScript *local_38;
  
  DObject::Serialize((DObject *)this,arc);
  local_40 = this->Scripts;
  ::Serialize(arc,"scripts",(DObject **)&local_40,(DObject **)0x0,(bool *)0x0);
  this->Scripts = local_40;
  local_40 = this->LastScript;
  def = (SavingRunningscript *)0x0;
  ::Serialize(arc,"lastscript",(DObject **)&local_40,(DObject **)0x0,(bool *)0x0);
  this->LastScript = local_40;
  this_00 = &this->RunningScripts;
  if (arc->w == (FWriter *)0x0) {
    M_Free(this_00->Nodes);
    this_00->Nodes = (Node *)0x0;
    (this->RunningScripts).LastFree = (Node *)0x0;
    (this->RunningScripts).Size = 0;
    (this->RunningScripts).NumUsed = 0;
    TMap<int,_DLevelScript_*,_THashTraits<int>,_TValueTraits<DLevelScript_*>_>::SetNodeVector
              (this_00,1);
    bVar2 = FSerializer::BeginArray(arc,"runningscripts");
    if (!bVar2) {
      return;
    }
    uVar4 = FSerializer::ArraySize(arc);
    if (uVar4 != 0) {
      do {
        ::Serialize(arc,(char *)0x0,(SavingRunningscript *)&local_40,def);
        pDVar1 = local_38;
        pNVar6 = TMap<int,_DLevelScript_*,_THashTraits<int>,_TValueTraits<DLevelScript_*>_>::GetNode
                           (this_00,(int)local_40);
        (pNVar6->Pair).Value = pDVar1;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
  }
  else {
    hVar3 = TMap<int,_DLevelScript_*,_THashTraits<int>,_TValueTraits<DLevelScript_*>_>::CountUsed
                      (this_00);
    if (hVar3 == 0) {
      return;
    }
    FSerializer::BeginArray(arc,"runningscripts");
    uVar4 = (this->RunningScripts).Size;
    if (uVar4 != 0) {
      uVar7 = 0;
      do {
        uVar8 = (ulong)uVar7;
        ppDVar5 = &this_00->Nodes[uVar8].Pair.Value;
        while (ppDVar5[-2] == (DLevelScript *)0x1) {
          uVar8 = uVar8 + 1;
          ppDVar5 = ppDVar5 + 3;
          if (uVar4 <= uVar8) goto LAB_003bc544;
        }
        pDVar1 = *ppDVar5;
        if (pDVar1 == (DLevelScript *)0x0) {
          __assert_fail("pair->Value != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_acs.cpp"
                        ,0xb74,"virtual void DACSThinker::Serialize(FSerializer &)");
        }
        uVar7 = (int)uVar8 + 1;
        local_40 = (DLevelScript *)CONCAT44(local_40._4_4_,((IPair *)(ppDVar5 + -1))->Key);
        local_38 = pDVar1;
        ::Serialize(arc,(char *)0x0,(SavingRunningscript *)&local_40,(SavingRunningscript *)pDVar1);
        uVar4 = (this->RunningScripts).Size;
      } while (uVar7 < uVar4);
    }
  }
LAB_003bc544:
  FSerializer::EndArray(arc);
  return;
}

Assistant:

void DACSThinker::Serialize(FSerializer &arc)
{
	Super::Serialize(arc);
	arc("scripts", Scripts)
		("lastscript", LastScript);

	if (arc.isWriting())
	{
		if (RunningScripts.CountUsed())
		{
			ScriptMap::Iterator it(RunningScripts);
			ScriptMap::Pair *pair;

			arc.BeginArray("runningscripts");
			while (it.NextPair(pair))
			{
				assert(pair->Value != nullptr);
				SavingRunningscript srs = { pair->Key, pair->Value };
				arc(nullptr, srs);
			}
			arc.EndArray();
		}
	}
	else // Loading
	{
		DLevelScript *script = nullptr;
		RunningScripts.Clear();
		if (arc.BeginArray("runningscripts"))
		{
			auto cnt = arc.ArraySize();
			for (unsigned i = 0; i < cnt; i++)
			{
				SavingRunningscript srs;
				arc(nullptr, srs);
				RunningScripts[srs.scriptnum] = srs.lscript;
			}
			arc.EndArray();
		}
	}
}